

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Subprocess::Communicate
          (Subprocess *this,Message *input,Message *output,string *error)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  __pid_t _Var4;
  __sighandler_t __handler;
  int *piVar5;
  long lVar6;
  LogMessage *pLVar7;
  char *pcVar8;
  long lVar9;
  ssize_t sVar10;
  undefined7 in_stack_ffffffffffffe898;
  undefined1 in_stack_ffffffffffffe89f;
  string local_16c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16a8;
  SubstituteArg local_1688;
  SubstituteArg local_1658;
  SubstituteArg local_1628;
  SubstituteArg local_15f8;
  SubstituteArg local_15c8;
  SubstituteArg local_1598;
  SubstituteArg local_1568;
  SubstituteArg local_1538;
  SubstituteArg local_1508;
  SubstituteArg local_14d8;
  string local_14a8;
  uint local_1488;
  undefined4 local_1484;
  int signal;
  SubstituteArg local_1450;
  SubstituteArg local_1420;
  SubstituteArg local_13f0;
  SubstituteArg local_13c0;
  SubstituteArg local_1390;
  SubstituteArg local_1360;
  SubstituteArg local_1330;
  SubstituteArg local_1300;
  SubstituteArg local_12d0;
  string local_12a0;
  uint local_1280;
  LogFinisher local_1279;
  int error_code;
  uint local_1240;
  int local_123c;
  int status;
  int n_1;
  char buffer [4096];
  LogFinisher local_229;
  int n;
  undefined1 *local_1f0;
  fd_set *__arr_1;
  __fd_mask *p_Stack_1e0;
  uint __i_1;
  fd_set *__arr;
  undefined1 local_1d0 [4];
  uint __i;
  fd_set write_fds;
  fd_set read_fds;
  int max_fd;
  int input_pos;
  string output_data;
  string input_data;
  SignalHandler *old_pipe_handler;
  byte local_69;
  LogMessage local_68;
  string *local_30;
  string *error_local;
  Message *output_local;
  Message *input_local;
  Subprocess *this_local;
  
  local_69 = 0;
  local_30 = error;
  error_local = (string *)output;
  output_local = input;
  input_local = (Message *)this;
  if (this->child_stdin_ == -1) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/subprocess.cc"
               ,0x15f);
    local_69 = 1;
    pLVar7 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (child_stdin_) != (-1): ");
    pLVar7 = internal::LogMessage::operator<<(pLVar7,"Must call Start() first.");
    internal::LogFinisher::operator=((LogFinisher *)((long)&old_pipe_handler + 3),pLVar7);
  }
  if ((local_69 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_68);
  }
  __handler = ::signal(0xd,(__sighandler_t)0x1);
  MessageLite::SerializeAsString_abi_cxx11_
            ((string *)((long)&output_data.field_2 + 8),&output_local->super_MessageLite);
  std::__cxx11::string::string((string *)&max_fd);
  read_fds.fds_bits[0xf]._4_4_ = 0;
  piVar5 = std::max<int>(&this->child_stdin_,&this->child_stdout_);
  iVar1 = *piVar5;
LAB_003d7d0e:
  if (this->child_stdout_ == -1) {
    if (this->child_stdin_ != -1) {
      close(this->child_stdin_);
      this->child_stdin_ = -1;
    }
    while (_Var4 = waitpid(this->child_pid_,(int *)&local_1240,0), _Var4 == -1) {
      piVar5 = __errno_location();
      if (*piVar5 != 4) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&error_code,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/subprocess.cc"
                   ,0x1ac);
        pLVar7 = internal::LogMessage::operator<<((LogMessage *)&error_code,"waitpid: ");
        piVar5 = __errno_location();
        pcVar8 = strerror(*piVar5);
        pLVar7 = internal::LogMessage::operator<<(pLVar7,pcVar8);
        internal::LogFinisher::operator=(&local_1279,pLVar7);
        internal::LogMessage::~LogMessage((LogMessage *)&error_code);
      }
    }
    ::signal(0xd,__handler);
    if ((local_1240 & 0x7f) == 0) {
      if ((int)(local_1240 & 0xff00) >> 8 == 0) {
        bVar2 = MessageLite::ParseFromString((MessageLite *)error_local,(string *)&max_fd);
        if (bVar2) {
          this_local._7_1_ = 1;
        }
        else {
          CEscape(&local_16c8,(string *)&max_fd);
          std::operator+(&local_16a8,"Plugin output is unparseable: ",&local_16c8);
          std::__cxx11::string::operator=((string *)local_30,(string *)&local_16a8);
          std::__cxx11::string::~string((string *)&local_16a8);
          std::__cxx11::string::~string((string *)&local_16c8);
          this_local._7_1_ = 0;
        }
      }
      else {
        local_1280 = local_1240 >> 8 & 0xff;
        strings::internal::SubstituteArg::SubstituteArg(&local_12d0,local_1280);
        strings::internal::SubstituteArg::SubstituteArg(&local_1300);
        strings::internal::SubstituteArg::SubstituteArg(&local_1330);
        strings::internal::SubstituteArg::SubstituteArg(&local_1360);
        strings::internal::SubstituteArg::SubstituteArg(&local_1390);
        strings::internal::SubstituteArg::SubstituteArg(&local_13c0);
        strings::internal::SubstituteArg::SubstituteArg(&local_13f0);
        strings::internal::SubstituteArg::SubstituteArg(&local_1420);
        strings::internal::SubstituteArg::SubstituteArg(&local_1450);
        strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)&signal);
        strings::Substitute_abi_cxx11_
                  (&local_12a0,(strings *)"Plugin failed with status code $0.",(char *)&local_12d0,
                   &local_1300,&local_1330,&local_1360,&local_1390,&local_13c0,&local_13f0,
                   &local_1420,&local_1450,(SubstituteArg *)&signal,
                   (SubstituteArg *)CONCAT17(in_stack_ffffffffffffe89f,in_stack_ffffffffffffe898));
        std::__cxx11::string::operator=((string *)local_30,(string *)&local_12a0);
        std::__cxx11::string::~string((string *)&local_12a0);
        this_local._7_1_ = 0;
      }
    }
    else if ((char)(((byte)local_1240 & 0x7f) + 1) >> 1 < '\x01') {
      std::__cxx11::string::operator=
                ((string *)local_30,"Neither WEXITSTATUS nor WTERMSIG is true?");
      this_local._7_1_ = 0;
    }
    else {
      local_1488 = local_1240 & 0x7f;
      strings::internal::SubstituteArg::SubstituteArg(&local_14d8,local_1488);
      strings::internal::SubstituteArg::SubstituteArg(&local_1508);
      strings::internal::SubstituteArg::SubstituteArg(&local_1538);
      strings::internal::SubstituteArg::SubstituteArg(&local_1568);
      strings::internal::SubstituteArg::SubstituteArg(&local_1598);
      strings::internal::SubstituteArg::SubstituteArg(&local_15c8);
      strings::internal::SubstituteArg::SubstituteArg(&local_15f8);
      strings::internal::SubstituteArg::SubstituteArg(&local_1628);
      strings::internal::SubstituteArg::SubstituteArg(&local_1658);
      strings::internal::SubstituteArg::SubstituteArg(&local_1688);
      strings::Substitute_abi_cxx11_
                (&local_14a8,(strings *)"Plugin killed by signal $0.",(char *)&local_14d8,
                 &local_1508,&local_1538,&local_1568,&local_1598,&local_15c8,&local_15f8,&local_1628
                 ,&local_1658,&local_1688,
                 (SubstituteArg *)CONCAT17(in_stack_ffffffffffffe89f,in_stack_ffffffffffffe898));
      std::__cxx11::string::operator=((string *)local_30,(string *)&local_14a8);
      std::__cxx11::string::~string((string *)&local_14a8);
      this_local._7_1_ = 0;
    }
    local_1484 = 1;
    std::__cxx11::string::~string((string *)&max_fd);
    std::__cxx11::string::~string((string *)(output_data.field_2._M_local_buf + 8));
    return (bool)(this_local._7_1_ & 1);
  }
  p_Stack_1e0 = write_fds.fds_bits + 0xf;
  for (__arr._4_4_ = 0; __arr._4_4_ < 0x10; __arr._4_4_ = __arr._4_4_ + 1) {
    p_Stack_1e0[__arr._4_4_] = 0;
  }
  local_1f0 = local_1d0;
  for (__arr_1._4_4_ = 0; __arr_1._4_4_ < 0x10; __arr_1._4_4_ = __arr_1._4_4_ + 1) {
    *(undefined8 *)(local_1f0 + (ulong)__arr_1._4_4_ * 8) = 0;
  }
  if (this->child_stdout_ != -1) {
    lVar6 = (long)(this->child_stdout_ / 0x40);
    write_fds.fds_bits[lVar6 + 0xf] =
         1L << ((byte)((long)this->child_stdout_ % 0x40) & 0x3f) | write_fds.fds_bits[lVar6 + 0xf];
  }
  if (this->child_stdin_ != -1) {
    lVar6 = (long)(this->child_stdin_ / 0x40);
    write_fds.fds_bits[lVar6 + -1] =
         1L << ((byte)((long)this->child_stdin_ % 0x40) & 0x3f) | write_fds.fds_bits[lVar6 + -1];
  }
  iVar3 = select(iVar1 + 1,(fd_set *)(write_fds.fds_bits + 0xf),(fd_set *)local_1d0,(fd_set *)0x0,
                 (timeval *)0x0);
  if (iVar3 < 0) goto code_r0x003d7ecc;
  goto LAB_003d7f7c;
code_r0x003d7ecc:
  piVar5 = __errno_location();
  if (*piVar5 != 4) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&n,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/subprocess.cc"
               ,0x17e);
    pLVar7 = internal::LogMessage::operator<<((LogMessage *)&n,"select: ");
    piVar5 = __errno_location();
    pcVar8 = strerror(*piVar5);
    pLVar7 = internal::LogMessage::operator<<(pLVar7,pcVar8);
    internal::LogFinisher::operator=(&local_229,pLVar7);
    internal::LogMessage::~LogMessage((LogMessage *)&n);
LAB_003d7f7c:
    if ((this->child_stdin_ != -1) &&
       ((write_fds.fds_bits[(long)(this->child_stdin_ / 0x40) + -1] &
        1L << ((byte)((long)this->child_stdin_ % 0x40) & 0x3f)) != 0)) {
      iVar3 = this->child_stdin_;
      lVar6 = std::__cxx11::string::data();
      lVar9 = std::__cxx11::string::size();
      sVar10 = write(iVar3,(void *)(lVar6 + read_fds.fds_bits[0xf]._4_4_),
                     lVar9 - read_fds.fds_bits[0xf]._4_4_);
      if ((int)sVar10 < 0) {
        read_fds.fds_bits[0xf]._4_4_ = std::__cxx11::string::size();
      }
      else {
        read_fds.fds_bits[0xf]._4_4_ = (int)sVar10 + read_fds.fds_bits[0xf]._4_4_;
      }
      lVar6 = std::__cxx11::string::size();
      if (read_fds.fds_bits[0xf]._4_4_ == lVar6) {
        close(this->child_stdin_);
        this->child_stdin_ = -1;
      }
    }
    if ((this->child_stdout_ != -1) &&
       ((write_fds.fds_bits[(long)(this->child_stdout_ / 0x40) + 0xf] &
        1L << ((byte)((long)this->child_stdout_ % 0x40) & 0x3f)) != 0)) {
      sVar10 = read(this->child_stdout_,&status,0x1000);
      local_123c = (int)sVar10;
      if (local_123c < 1) {
        close(this->child_stdout_);
        this->child_stdout_ = -1;
      }
      else {
        std::__cxx11::string::append((char *)&max_fd,(ulong)&status);
      }
    }
  }
  goto LAB_003d7d0e;
}

Assistant:

bool Subprocess::Communicate(const Message& input, Message* output,
                             string* error) {

  GOOGLE_CHECK_NE(child_stdin_, -1) << "Must call Start() first.";

  // The "sighandler_t" typedef is GNU-specific, so define our own.
  typedef void SignalHandler(int);

  // Make sure SIGPIPE is disabled so that if the child dies it doesn't kill us.
  SignalHandler* old_pipe_handler = signal(SIGPIPE, SIG_IGN);

  string input_data = input.SerializeAsString();
  string output_data;

  int input_pos = 0;
  int max_fd = std::max(child_stdin_, child_stdout_);

  while (child_stdout_ != -1) {
    fd_set read_fds;
    fd_set write_fds;
    FD_ZERO(&read_fds);
    FD_ZERO(&write_fds);
    if (child_stdout_ != -1) {
      FD_SET(child_stdout_, &read_fds);
    }
    if (child_stdin_ != -1) {
      FD_SET(child_stdin_, &write_fds);
    }

    if (select(max_fd + 1, &read_fds, &write_fds, NULL, NULL) < 0) {
      if (errno == EINTR) {
        // Interrupted by signal.  Try again.
        continue;
      } else {
        GOOGLE_LOG(FATAL) << "select: " << strerror(errno);
      }
    }

    if (child_stdin_ != -1 && FD_ISSET(child_stdin_, &write_fds)) {
      int n = write(child_stdin_, input_data.data() + input_pos,
                                  input_data.size() - input_pos);
      if (n < 0) {
        // Child closed pipe.  Presumably it will report an error later.
        // Pretend we're done for now.
        input_pos = input_data.size();
      } else {
        input_pos += n;
      }

      if (input_pos == input_data.size()) {
        // We're done writing.  Close.
        close(child_stdin_);
        child_stdin_ = -1;
      }
    }

    if (child_stdout_ != -1 && FD_ISSET(child_stdout_, &read_fds)) {
      char buffer[4096];
      int n = read(child_stdout_, buffer, sizeof(buffer));

      if (n > 0) {
        output_data.append(buffer, n);
      } else {
        // We're done reading.  Close.
        close(child_stdout_);
        child_stdout_ = -1;
      }
    }
  }

  if (child_stdin_ != -1) {
    // Child did not finish reading input before it closed the output.
    // Presumably it exited with an error.
    close(child_stdin_);
    child_stdin_ = -1;
  }

  int status;
  while (waitpid(child_pid_, &status, 0) == -1) {
    if (errno != EINTR) {
      GOOGLE_LOG(FATAL) << "waitpid: " << strerror(errno);
    }
  }

  // Restore SIGPIPE handling.
  signal(SIGPIPE, old_pipe_handler);

  if (WIFEXITED(status)) {
    if (WEXITSTATUS(status) != 0) {
      int error_code = WEXITSTATUS(status);
      *error = strings::Substitute(
          "Plugin failed with status code $0.", error_code);
      return false;
    }
  } else if (WIFSIGNALED(status)) {
    int signal = WTERMSIG(status);
    *error = strings::Substitute(
        "Plugin killed by signal $0.", signal);
    return false;
  } else {
    *error = "Neither WEXITSTATUS nor WTERMSIG is true?";
    return false;
  }

  if (!output->ParseFromString(output_data)) {
    *error = "Plugin output is unparseable: " + CEscape(output_data);
    return false;
  }

  return true;
}